

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::FeedbackPrimitiveTypeCase::
getGeometrySource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  ContextType local_1cc;
  string local_1c8;
  ostringstream buf;
  
  iVar1 = *(int *)((long)this + 0x78);
  iVar2 = *(int *)((long)this + 0x7c);
  iVar3 = *(int *)((long)this + 0x80);
  pcVar9 = "capture_vertex_triangle_strip";
  if (iVar3 == 1) {
    pcVar9 = "capture_vertex_line_strip";
  }
  pcVar9 = pcVar9 + 0xf;
  uVar6 = iVar1 == 2 ^ 3;
  if (iVar2 != 0) {
    uVar6 = 1;
  }
  uVar7 = (iVar3 == 1) + 3;
  if (iVar3 == 0) {
    pcVar9 = "points";
    uVar7 = 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  poVar4 = std::operator<<((ostream *)&buf,"${VERSION_DECL}\n${EXTENSION_GEOMETRY_SHADER}layout(");
  pcVar5 = "triangles";
  if (iVar1 == 2) {
    pcVar5 = "lines";
  }
  pcVar8 = "points";
  if (iVar2 == 0) {
    pcVar8 = pcVar5;
  }
  poVar4 = std::operator<<(poVar4,pcVar8);
  poVar4 = std::operator<<(poVar4,") in;\nlayout(");
  poVar4 = std::operator<<(poVar4,pcVar9);
  poVar4 = std::operator<<(poVar4,", max_vertices=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar7 * uVar6);
  std::operator<<(poVar4,
                  ") out;\n\nin highp vec4 v_tessellationCoords[];\nout highp vec4 tf_someVertexPosition;\n\nvoid main (void)\n{\n\t// Emit primitive\n\tfor (int ndx = 0; ndx < gl_in.length(); ++ndx)\n\t{\n"
                 );
  if ((ulong)*(uint *)((long)this + 0x80) < 3) {
    std::operator<<((ostream *)&buf,
                    &DAT_0083c0fc +
                    *(int *)(&DAT_0083c0fc + (ulong)*(uint *)((long)this + 0x80) * 4));
    std::operator<<((ostream *)&buf,"\t}\n}\n");
    std::__cxx11::stringbuf::str();
    local_1cc.super_ApiType.m_bits =
         (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
    anon_unknown_1::specializeShader(__return_storage_ptr__,&local_1c8,&local_1cc);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,SSBOArrayLengthTests::init::arraysSized + 1,
               (allocator<char> *)&local_1c8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  return __return_storage_ptr__;
}

Assistant:

std::string FeedbackPrimitiveTypeCase::getGeometrySource (void) const
{
	const char* const	geometryInputPrimitive			= (m_tessellationPointMode) ? ("points") : (m_tessellationOutput == TESSELLATION_OUT_ISOLINES) ? ("lines") : ("triangles");
	const char* const	geometryOutputPrimitive			= (m_geometryOutputType == GEOMETRY_OUTPUT_POINTS) ? ("points") : (m_geometryOutputType == GEOMETRY_OUTPUT_LINES) ? ("line_strip") : ("triangle_strip");
	const int			numInputVertices				= (m_tessellationPointMode) ? (1) : (m_tessellationOutput == TESSELLATION_OUT_ISOLINES) ? (2) : (3);
	const int			numSingleVertexOutputVertices	= (m_geometryOutputType == GEOMETRY_OUTPUT_POINTS) ? (1) : (m_geometryOutputType == GEOMETRY_OUTPUT_LINES) ? (4) : (3);
	const int			numEmitVertices					= numInputVertices * numSingleVertexOutputVertices;
	std::ostringstream	buf;

	buf <<	"${VERSION_DECL}\n"
			"${EXTENSION_GEOMETRY_SHADER}"
			"layout(" << geometryInputPrimitive << ") in;\n"
			"layout(" << geometryOutputPrimitive << ", max_vertices=" << numEmitVertices <<") out;\n"
			"\n"
			"in highp vec4 v_tessellationCoords[];\n"
			"out highp vec4 tf_someVertexPosition;\n"
			"\n"
			"void main (void)\n"
			"{\n"
			"	// Emit primitive\n"
			"	for (int ndx = 0; ndx < gl_in.length(); ++ndx)\n"
			"	{\n";

	switch (m_geometryOutputType)
	{
		case GEOMETRY_OUTPUT_POINTS:
			buf <<	"		// Draw point on vertex\n"
					"		gl_Position = gl_in[ndx].gl_Position;\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n";
			break;

		case GEOMETRY_OUTPUT_LINES:
			buf <<	"		// Draw cross on vertex\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4(-0.02, -0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4( 0.02,  0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		EndPrimitive();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4( 0.02, -0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4(-0.02,  0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		EndPrimitive();\n";
			break;

		case GEOMETRY_OUTPUT_TRIANGLES:
			buf <<	"		// Draw triangle on vertex\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4(  0.00, -0.02, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4(  0.02,  0.00, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		gl_Position = gl_in[ndx].gl_Position + vec4( -0.02,  0.00, 0.0, 0.0);\n"
					"		tf_someVertexPosition = gl_in[gl_in.length() - 1].gl_Position;\n"
					"		EmitVertex();\n"
					"		EndPrimitive();\n";
			break;

		default:
			DE_ASSERT(false);
			return "";
	}

	buf <<	"	}\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}